

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O0

void __thiscall CommandLineParser::getNextOption(CommandLineParser *this)

{
  bool bVar1;
  bool local_a2;
  string local_90;
  byte local_6b;
  byte local_6a;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  CommandLineParser *local_10;
  CommandLineParser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  local_6a = 0;
  local_6b = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-",&local_31);
  bVar1 = argumentStartsWith(this,&local_30);
  local_a2 = true;
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_6a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"--",&local_69);
    local_6b = 1;
    local_a2 = argumentStartsWith(this,&local_68);
  }
  if ((local_6b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  if ((local_6a & 1) != 0) {
    std::allocator<char>::~allocator(&local_69);
  }
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (local_a2 == false) {
    std::__cxx11::string::operator=((string *)&this->m_option,"");
  }
  else {
    getNextArgument_abi_cxx11_(&local_90,this);
    std::__cxx11::string::operator=((string *)&this->m_option,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void 
CommandLineParser::getNextOption()
{
  if ( argumentStartsWith( "-" )  ||  argumentStartsWith( "--" ) )
    m_option = getNextArgument();
  else
    m_option = "";
}